

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiResponse.cpp
# Opt level: O2

void __thiscall xmrig::HttpApiResponse::end(HttpApiResponse *this)

{
  Document *this_00;
  bool bVar1;
  size_t sVar2;
  Ch *data;
  allocator local_ca;
  allocator local_c9;
  undefined1 local_c8 [32];
  char *local_a8;
  size_t local_a0;
  undefined1 local_98 [32];
  char *pcStack_78;
  char *local_70;
  size_t local_68;
  int local_60;
  undefined2 local_5c;
  undefined8 local_58;
  StringRefType local_50;
  StringRefType local_40;
  StringRefType local_30;
  
  std::__cxx11::string::string((string *)local_98,"Access-Control-Allow-Origin",&local_c9);
  std::__cxx11::string::string((string *)local_c8,"*",&local_ca);
  HttpResponse::setHeader(&this->super_HttpResponse,(string *)local_98,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string((string *)local_98,"Access-Control-Allow-Methods",&local_c9);
  std::__cxx11::string::string((string *)local_c8,"GET, PUT, POST, DELETE",&local_ca);
  HttpResponse::setHeader(&this->super_HttpResponse,(string *)local_98,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string((string *)local_98,"Access-Control-Allow-Headers",&local_c9);
  std::__cxx11::string::string((string *)local_c8,"Authorization, Content-Type",&local_ca);
  HttpResponse::setHeader(&this->super_HttpResponse,(string *)local_98,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_98);
  if (399 < (this->super_HttpResponse).m_statusCode) {
    this_00 = &this->m_doc;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&this_00->
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"status");
    if (!bVar1) {
      local_30.s = "status";
      local_30.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>(&this_00->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ,&local_30,(this->super_HttpResponse).m_statusCode,(this->m_doc).allocator_);
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&this_00->
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"error");
    if (!bVar1) {
      local_40.s = "error";
      local_40.length = 5;
      local_50.s = http_status_str((this->super_HttpResponse).m_statusCode);
      sVar2 = strlen(local_50.s);
      local_50.length = (SizeType)sVar2;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&this_00->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_40,&local_50,(this->m_doc).allocator_);
    }
  }
  if ((this->m_doc).
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.s.length == 0) {
    HttpResponse::end(&this->super_HttpResponse,(char *)0x0,0);
  }
  else {
    std::__cxx11::string::string((string *)local_98,"Content-Type",&local_c9);
    std::__cxx11::string::string((string *)local_c8,"application/json",&local_ca);
    HttpResponse::setHeader(&this->super_HttpResponse,(string *)local_98,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_98);
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (CrtAllocator *)0x0;
    local_a8 = (char *)0x0;
    local_a0 = 0x1000;
    local_98._8_8_ = (CrtAllocator *)0x0;
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    pcStack_78 = (char *)0x0;
    local_70 = (char *)0x0;
    local_68 = 0x200;
    local_5c._0_1_ = false;
    local_5c._1_1_ = 0x20;
    local_58._0_4_ = 4;
    local_58._4_4_ = kFormatSingleLineArray;
    local_60 = 10;
    local_98._0_8_ = (string *)local_c8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&this->m_doc,
               (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_98);
    data = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      local_c8);
    HttpResponse::end(&this->super_HttpResponse,data,local_c8._24_8_ - local_c8._16_8_);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack
              ((Stack<rapidjson::CrtAllocator> *)(local_98 + 8));
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack
              ((Stack<rapidjson::CrtAllocator> *)local_c8);
  }
  return;
}

Assistant:

void xmrig::HttpApiResponse::end()
{
    using namespace rapidjson;

    setHeader("Access-Control-Allow-Origin", "*");
    setHeader("Access-Control-Allow-Methods", "GET, PUT, POST, DELETE");
    setHeader("Access-Control-Allow-Headers", "Authorization, Content-Type");

    if (statusCode() >= 400) {
        if (!m_doc.HasMember(kStatus)) {
            m_doc.AddMember(StringRef(kStatus), statusCode(), m_doc.GetAllocator());
        }

        if (!m_doc.HasMember(kError)) {
            m_doc.AddMember(StringRef(kError), StringRef(http_status_str(static_cast<http_status>(statusCode()))), m_doc.GetAllocator());
        }
    }

    if (!m_doc.MemberCount()) {
        return HttpResponse::end();
    }

    setHeader("Content-Type", "application/json");

    StringBuffer buffer(nullptr, 4096);
    PrettyWriter<StringBuffer> writer(buffer);
    writer.SetMaxDecimalPlaces(10);
    writer.SetFormatOptions(kFormatSingleLineArray);

    m_doc.Accept(writer);

    HttpResponse::end(buffer.GetString(), buffer.GetSize());
}